

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionMetadata.cpp
# Opt level: O2

bool Js::JavascriptExceptionMetadata::PopulateMetadataFromException
               (Var metadata,JavascriptExceptionObject *recordedException,
               ScriptContext *scriptContext)

{
  Type TVar1;
  Utf8SourceInfo *this;
  code *pcVar2;
  BufferStringBuilder instance;
  ULONG UVar3;
  bool bVar4;
  char16 cVar5;
  uint32 uVar6;
  charcount_t cVar7;
  uint uVar8;
  FunctionBody *this_00;
  LineOffsetCache *this_01;
  Var pvVar9;
  LPCWSTR content;
  JavascriptString *pJVar10;
  LPCUTF8 puVar11;
  char16 *buffer;
  undefined4 *puVar12;
  uint uVar13;
  int iVar14;
  LPCUTF8 local_68;
  LPCUTF8 functionStart;
  BufferStringBuilder builder;
  charcount_t local_44;
  charcount_t local_40;
  charcount_t startByteOffset;
  ULONG local_38;
  LONG column;
  ULONG line;
  
  TVar1 = (recordedException->exceptionContext).m_throwingFunctionByteCodeOffset;
  builder.m_string = (WritableString *)metadata;
  this_00 = JavascriptExceptionObject::GetFunctionBody(recordedException);
  if (((((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
        field_0xa8 & 4) != 0) ||
     (bVar4 = FunctionBody::GetLineCharOffset(this_00,TVar1,&local_38,(LONG *)&startByteOffset,true)
     , !bVar4)) {
    local_38 = 0;
    startByteOffset = 0;
  }
  this = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  Utf8SourceInfo::EnsureLineOffsetCache(this);
  this_01 = Utf8SourceInfo::GetLineOffsetCache(this);
  UVar3 = local_38;
  uVar6 = LineOffsetCache::GetLineCount(this_01);
  if ((UVar3 < uVar6) && (uVar13 = local_38 + 1, uVar13 != 0)) {
    pvVar9 = JavascriptNumber::ToVar((double)local_38);
    instance = builder;
    JavascriptOperators::OP_SetProperty
              (builder.m_string,0xf7,pvVar9,scriptContext,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    pvVar9 = JavascriptNumber::ToVar((double)(int)startByteOffset);
    JavascriptOperators::OP_SetProperty
              (instance.m_string,0x2d2,pvVar9,scriptContext,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    pvVar9 = JavascriptNumber::ToVar(0.0);
    JavascriptOperators::OP_SetProperty
              (instance.m_string,0xd1,pvVar9,scriptContext,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    content = ParseableFunctionInfo::GetSourceName(&this_00->super_ParseableFunctionInfo);
    pJVar10 = JavascriptString::NewCopySz(content,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance.m_string,0x2d3,pJVar10,scriptContext,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    puVar11 = Utf8SourceInfo::GetSource
                        (this,L"Jsrt::JsExperimentalGetAndClearExceptionWithMetadata");
    local_44 = 0;
    column = 0;
    local_40 = LineOffsetCache::GetCharacterOffsetForLine(this_01,local_38,&local_44);
    uVar6 = LineOffsetCache::GetLineCount(this_01);
    if (uVar13 < uVar6) {
      cVar7 = LineOffsetCache::GetCharacterOffsetForLine(this_01,uVar13,(charcount_t *)&column);
      uVar13 = column - 1;
      if (puVar11[uVar13] == '\n') {
        iVar14 = cVar7 - 1;
        if ((uVar13 != 0) && (puVar11[column - 2U] == '\r')) {
          iVar14 = cVar7 - 2;
          uVar13 = column - 2U;
        }
      }
      else {
        functionStart = (LPCUTF8)CONCAT44(functionStart._4_4_,1);
        local_68 = puVar11 + ((ulong)(uint)column - 3);
        cVar5 = utf8::Decode(&local_68,puVar11 + (uint)column,(DecodeOptions *)&functionStart,
                             (bool *)0x0);
        if ((cVar5 & 0xfffeU) == 0x2028) {
          uVar13 = column - 3;
        }
        else {
          uVar13 = column - 1;
          if (puVar11[uVar13] != '\r') {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExceptionMetadata.cpp"
                                        ,0x93,"(0)",
                                        "Line ending logic out of sync between Js::JavascriptExceptionMetadata and Js::LineOffsetCache::GetCharacterOffsetForLine"
                                       );
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar12 = 0;
            goto LAB_00a85551;
          }
        }
        iVar14 = cVar7 - 1;
      }
    }
    else {
      TVar1 = (this_00->super_ParseableFunctionInfo).m_cbLength;
      cVar7 = ParseableFunctionInfo::StartInDocument(&this_00->super_ParseableFunctionInfo);
      column = cVar7 + TVar1;
      TVar1 = (this_00->super_ParseableFunctionInfo).m_cchLength;
      uVar8 = ParseableFunctionInfo::StartOffset(&this_00->super_ParseableFunctionInfo);
      iVar14 = uVar8 + TVar1;
      uVar13 = column;
    }
    column = uVar13;
    local_68 = puVar11 + local_44;
    functionStart =
         (LPCUTF8)BufferStringBuilder::WritableString::New(iVar14 - local_40,scriptContext);
    uVar13 = *(uint *)&this->field_0xa8;
    buffer = BufferStringBuilder::DangerousGetWritableBuffer((BufferStringBuilder *)&functionStart);
    utf8::DecodeUnitsInto
              (buffer,&local_68,puVar11 + (uint)column,uVar13 >> 1 & doAllowThreeByteSurrogates,
               (bool *)0x0);
    pJVar10 = BufferStringBuilder::ToString((BufferStringBuilder *)&functionStart);
    JavascriptOperators::OP_SetProperty
              (builder.m_string,0x153,pJVar10,scriptContext,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    bVar4 = true;
  }
  else {
LAB_00a85551:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool JavascriptExceptionMetadata::PopulateMetadataFromException(Var metadata, JavascriptExceptionObject * recordedException, ScriptContext * scriptContext) {
        uint32 offset = recordedException->GetByteCodeOffset();
        FunctionBody * functionBody = recordedException->GetFunctionBody();
        ULONG line;
        LONG column;
        if (functionBody->GetUtf8SourceInfo()->GetIsLibraryCode() ||
            !functionBody->GetLineCharOffset(offset, &line, &column)) {
            line = 0;
            column = 0;
        }

        Js::Utf8SourceInfo* sourceInfo = functionBody->GetUtf8SourceInfo();
        sourceInfo->EnsureLineOffsetCache();
        LineOffsetCache *cache = sourceInfo->GetLineOffsetCache();

        if (line >= cache->GetLineCount())
        {
            return false;
        }

        uint32 nextLine;
        if (UInt32Math::Add(line, 1, &nextLine))
        {
            // Overflowed
            return false;
        }

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::line,
            Js::JavascriptNumber::New(line, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::column,
            Js::JavascriptNumber::New(column, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::length,
            Js::JavascriptNumber::New(0, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::url,
            Js::JavascriptString::NewCopySz(functionBody->GetSourceName(), scriptContext), scriptContext);

        LPCUTF8 functionSource = sourceInfo->GetSource(_u("Jsrt::JsExperimentalGetAndClearExceptionWithMetadata"));

        charcount_t startByteOffset = 0;
        charcount_t endByteOffset = 0;
        charcount_t startCharOffset = 0;
        charcount_t endCharOffset = 0;

        
        startCharOffset = cache->GetCharacterOffsetForLine(line, &startByteOffset);

        if (nextLine >= cache->GetLineCount())
        {
            endByteOffset = functionBody->LengthInBytes() + functionBody->StartInDocument();
            endCharOffset = functionBody->LengthInChars() + functionBody->StartOffset();
        }
        else
        {
            endCharOffset = cache->GetCharacterOffsetForLine(nextLine, &endByteOffset);

            // The offsets above point to the start of the following line,
            // while we need to find the end of the current line.
            // To do so, just step back over the preceeding newline character(s)
            if (functionSource[endByteOffset - 1] == _u('\n'))
            {
                endCharOffset--;
                endByteOffset--;
                // This may have been \r\n
                if (endByteOffset > 0 && functionSource[endByteOffset - 1] == _u('\r'))
                {
                    endCharOffset--;
                    endByteOffset--;
                }
            }
            else
            {
                utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;
                LPCUTF8 potentialNewlineStart = functionSource + endByteOffset - 3;
                char16 decodedCharacter = utf8::Decode(potentialNewlineStart, functionSource + endByteOffset, options);
                if (decodedCharacter == 0x2028 || decodedCharacter == 0x2029)
                {
                    endCharOffset--;
                    endByteOffset -= 3;
                }
                else if (functionSource[endByteOffset - 1] == _u('\r'))
                {
                    endCharOffset--;
                    endByteOffset--;
                }
                else
                {
                    AssertMsg(FALSE, "Line ending logic out of sync between Js::JavascriptExceptionMetadata and Js::LineOffsetCache::GetCharacterOffsetForLine");
                    return false;
                }
            }
        }

        LPCUTF8 functionStart = functionSource + startByteOffset;

        Js::BufferStringBuilder builder(endCharOffset - startCharOffset, scriptContext);
        utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
        utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), functionStart, functionSource + endByteOffset, options);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::source,
            builder.ToString(), scriptContext);

        return true;
    }